

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KryoFlux.cpp
# Opt level: O2

int __thiscall KryoFlux::SelectDevice(KryoFlux *this,int device)

{
  int iVar1;
  string local_30;
  
  (**(code **)(*(long *)this + 0x18))(&local_30,this,6,device,0);
  iVar1 = ResponseCode(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return iVar1;
}

Assistant:

int KryoFlux::SelectDevice(int device)
{
    return ResponseCode(Control(REQ_DEVICE, device));
}